

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe.c
# Opt level: O3

void av1_encode_frame(AV1_COMP *cpi)

{
  AV1_COMMON *cm;
  uint uVar1;
  uint uVar2;
  RefCntBuffer *pRVar3;
  STATS_BUFFER_CTX *pSVar4;
  REFERENCE_MODE RVar5;
  uint uVar6;
  int total_valid_refs;
  uint uVar7;
  uint8_t *puVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  FIRSTPASS_STATS *pFVar14;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  FIRSTPASS_STATS *pFVar18;
  byte bVar19;
  
  cm = &cpi->common;
  (cpi->common).features.reduced_tx_set_used = (cpi->oxcf).txfm_cfg.reduced_tx_type_set;
  if ((((cpi->common).seg.enabled != '\0') && ((cpi->common).seg.update_map != '\0')) &&
     (iVar10 = (cpi->common).mi_params.mi_rows, 0 < iVar10)) {
    iVar13 = (cpi->common).seg.last_active_segid;
    uVar1 = (cpi->common).mi_params.mi_cols;
    puVar8 = (cpi->enc_seg).map;
    iVar12 = 0;
    do {
      if (0 < (int)uVar1) {
        uVar17 = 0;
        do {
          bVar19 = puVar8[uVar17];
          if (iVar13 <= (int)(uint)puVar8[uVar17]) {
            bVar19 = (byte)iVar13;
          }
          puVar8[uVar17] = bVar19;
          uVar17 = uVar17 + 1;
        } while (uVar1 != uVar17);
      }
      puVar8 = puVar8 + (int)uVar1;
      iVar12 = iVar12 + 1;
    } while (iVar12 != iVar10);
  }
  av1_setup_frame_buf_refs(cm);
  pRVar3 = (cpi->common).cur_frame;
  uVar1 = (cpi->common).current_frame.display_order_hint;
  uVar6 = cpi->ref_frame_flags;
  uVar7 = 0;
  lVar11 = 1;
  do {
    uVar7 = (uVar7 + 1) - (uint)((""[lVar11] & uVar6) == 0);
    lVar11 = lVar11 + 1;
  } while (lVar11 != 8);
  uVar9 = (cpi->oxcf).ref_frm_cfg.max_reference_frames;
  uVar2 = (cpi->sf).inter_sf.selective_ref_frame;
  uVar15 = 7;
  if (2 < (int)uVar2) {
    uVar15 = 4;
    if ((uVar2 < 6) && (uVar15 = 6, (uVar6 & 2) != 0 && uVar2 == 5)) {
      uVar15 = pRVar3->ref_display_order_hint[1] - uVar1;
      uVar2 = -uVar15;
      if (0 < (int)uVar15) {
        uVar2 = uVar15;
      }
      uVar15 = 5;
      if ((uVar2 < 3) && (uVar15 = 6, AOM_RC_FIRST_PASS < (cpi->oxcf).pass)) {
        pSVar4 = (cpi->ppi->twopass).stats_buf_ctx;
        pFVar14 = pSVar4->stats_in_start + uVar1;
        pFVar18 = (FIRSTPASS_STATS *)0x0;
        if (pFVar14 <= pSVar4->stats_in_end) {
          pFVar18 = pFVar14;
        }
        uVar15 = (100.0 < pFVar18->coded_error || pFVar18->coded_error == 100.0) + 5;
      }
    }
  }
  if (uVar15 < uVar9) {
    uVar9 = uVar15;
  }
  if (uVar9 < uVar7) {
    uVar17 = 0;
    do {
      if ((uVar6 & ""["\x03\x02\x06\x05"[uVar17]]) != 0) {
        bVar19 = "\x03\x02\x06\x05"[uVar17] - 2;
        if ((bVar19 < 5) && ((0x1bU >> (bVar19 & 0x1f) & 1) != 0)) {
          uVar6 = uVar6 & (&DAT_00d5d4e8)[bVar19];
          cpi->ref_frame_flags = uVar6;
        }
        uVar7 = uVar7 - 1;
      }
    } while ((uVar17 < 3) && (uVar17 = uVar17 + 1, (int)uVar9 < (int)uVar7));
  }
  (cpi->ref_frame_dist_info).nearest_past_ref = -1;
  (cpi->ref_frame_dist_info).nearest_future_ref = -1;
  iVar10 = 0x7fffffff;
  lVar11 = 0;
  iVar13 = 0x7fffffff;
  do {
    (cpi->ref_frame_dist_info).ref_relative_dist[lVar11] = 0;
    if ((uVar6 & ""[lVar11 + 1]) != 0) {
      iVar16 = pRVar3->ref_display_order_hint[lVar11] -
               (cpi->common).current_frame.display_order_hint;
      (cpi->ref_frame_dist_info).ref_relative_dist[lVar11] = iVar16;
      iVar12 = -iVar16;
      if (0 < iVar16) {
        iVar12 = iVar16;
      }
      if ((iVar16 < 0) && (iVar12 < iVar13)) {
        (cpi->ref_frame_dist_info).nearest_past_ref = (char)lVar11 + '\x01';
        iVar13 = iVar12;
      }
      else if (0 < iVar16 && iVar16 < iVar10) {
        (cpi->ref_frame_dist_info).nearest_future_ref = (char)lVar11 + '\x01';
        iVar10 = iVar16;
      }
    }
    lVar11 = lVar11 + 1;
  } while (lVar11 != 7);
  av1_setup_frame_sign_bias(cm);
  (cpi->td).rd_counts.newmv_or_intra_blocks = 0;
  cpi->palette_pixel_num = 0;
  if (((cpi->sf).hl_sf.frame_parameter_update == 0) && ((cpi->sf).rt_sf.use_comp_ref_nonrd == 0)) {
    if ((cpi->common).current_frame.reference_mode == '\x02') {
      (cpi->common).current_frame.reference_mode = '\0';
    }
    encode_frame_internal(cpi);
    return;
  }
  (cpi->common).current_frame.reference_mode =
       (((cpi->common).current_frame.frame_type & 0xfd) != 0) * '\x02';
  (cpi->common).features.interp_filter = ((cpi->common).tiles.large_scale == 0) << 2;
  (cpi->common).features.switchable_motion_mode =
       (bool)((cpi->oxcf).motion_mode_cfg.enable_obmc | (cpi->common).features.allow_warped_motion);
  (cpi->td).rd_counts.compound_ref_used_flag = 0;
  (cpi->td).rd_counts.skip_mode_used_flag = 0;
  encode_frame_internal(cpi);
  RVar5 = (cpi->common).current_frame.reference_mode;
  if (RVar5 == '\x02') {
    if ((cpi->td).rd_counts.compound_ref_used_flag == 0) {
      (cpi->common).current_frame.reference_mode = '\0';
      RVar5 = '\0';
      goto LAB_00a05e41;
    }
    if (((cm->current_frame).frame_type & 0xfd) == 0) goto LAB_00a05e51;
LAB_00a05e24:
    if (((cpi->common).current_frame.skip_mode_info.skip_mode_flag == 0) ||
       ((cpi->td).rd_counts.skip_mode_used_flag != 0)) goto LAB_00a05e65;
  }
  else {
LAB_00a05e41:
    if (RVar5 != '\0' && ((cm->current_frame).frame_type & 0xfd) != 0) goto LAB_00a05e24;
LAB_00a05e51:
    (cpi->common).current_frame.skip_mode_info.skip_mode_allowed = 0;
  }
  (cpi->common).current_frame.skip_mode_info.skip_mode_flag = 0;
LAB_00a05e65:
  if ((((cpi->common).tiles.large_scale == 0) && ((cpi->common).features.tx_mode == '\x02')) &&
     ((cpi->td).mb.txfm_search_info.txb_split_count == 0)) {
    (cpi->common).features.tx_mode = '\x01';
  }
  return;
}

Assistant:

void av1_encode_frame(AV1_COMP *cpi) {
  AV1_COMMON *const cm = &cpi->common;
  CurrentFrame *const current_frame = &cm->current_frame;
  FeatureFlags *const features = &cm->features;
  RD_COUNTS *const rdc = &cpi->td.rd_counts;
  const AV1EncoderConfig *const oxcf = &cpi->oxcf;
  // Indicates whether or not to use a default reduced set for ext-tx
  // rather than the potential full set of 16 transforms
  features->reduced_tx_set_used = oxcf->txfm_cfg.reduced_tx_type_set;

  // Make sure segment_id is no larger than last_active_segid.
  if (cm->seg.enabled && cm->seg.update_map) {
    const int mi_rows = cm->mi_params.mi_rows;
    const int mi_cols = cm->mi_params.mi_cols;
    const int last_active_segid = cm->seg.last_active_segid;
    uint8_t *map = cpi->enc_seg.map;
    for (int mi_row = 0; mi_row < mi_rows; ++mi_row) {
      for (int mi_col = 0; mi_col < mi_cols; ++mi_col) {
        map[mi_col] = AOMMIN(map[mi_col], last_active_segid);
      }
      map += mi_cols;
    }
  }

  av1_setup_frame_buf_refs(cm);
  enforce_max_ref_frames(cpi, &cpi->ref_frame_flags,
                         cm->cur_frame->ref_display_order_hint,
                         cm->current_frame.display_order_hint);
  set_rel_frame_dist(&cpi->common, &cpi->ref_frame_dist_info,
                     cpi->ref_frame_flags);
  av1_setup_frame_sign_bias(cm);

  // If global motion is enabled, then every buffer which is used as either
  // a source or a ref frame should have an image pyramid allocated.
  // Check here so that issues can be caught early in debug mode
#if !defined(NDEBUG) && !CONFIG_REALTIME_ONLY
  if (cpi->alloc_pyramid) {
    assert(cpi->source->y_pyramid);
    for (int ref_frame = LAST_FRAME; ref_frame <= ALTREF_FRAME; ++ref_frame) {
      const RefCntBuffer *const buf = get_ref_frame_buf(cm, ref_frame);
      if (buf != NULL) {
        assert(buf->buf.y_pyramid);
      }
    }
  }
#endif  // !defined(NDEBUG) && !CONFIG_REALTIME_ONLY

#if CONFIG_MISMATCH_DEBUG
  mismatch_reset_frame(av1_num_planes(cm));
#endif

  rdc->newmv_or_intra_blocks = 0;
  cpi->palette_pixel_num = 0;

  if (cpi->sf.hl_sf.frame_parameter_update ||
      cpi->sf.rt_sf.use_comp_ref_nonrd) {
    if (frame_is_intra_only(cm))
      current_frame->reference_mode = SINGLE_REFERENCE;
    else
      current_frame->reference_mode = REFERENCE_MODE_SELECT;

    features->interp_filter = SWITCHABLE;
    if (cm->tiles.large_scale) features->interp_filter = EIGHTTAP_REGULAR;

    features->switchable_motion_mode = is_switchable_motion_mode_allowed(
        features->allow_warped_motion, oxcf->motion_mode_cfg.enable_obmc);

    rdc->compound_ref_used_flag = 0;
    rdc->skip_mode_used_flag = 0;

    encode_frame_internal(cpi);

    if (current_frame->reference_mode == REFERENCE_MODE_SELECT) {
      // Use a flag that includes 4x4 blocks
      if (rdc->compound_ref_used_flag == 0) {
        current_frame->reference_mode = SINGLE_REFERENCE;
#if CONFIG_ENTROPY_STATS
        av1_zero(cpi->td.counts->comp_inter);
#endif  // CONFIG_ENTROPY_STATS
      }
    }
    // Re-check on the skip mode status as reference mode may have been
    // changed.
    SkipModeInfo *const skip_mode_info = &current_frame->skip_mode_info;
    if (frame_is_intra_only(cm) ||
        current_frame->reference_mode == SINGLE_REFERENCE) {
      skip_mode_info->skip_mode_allowed = 0;
      skip_mode_info->skip_mode_flag = 0;
    }
    if (skip_mode_info->skip_mode_flag && rdc->skip_mode_used_flag == 0)
      skip_mode_info->skip_mode_flag = 0;

    if (!cm->tiles.large_scale) {
      if (features->tx_mode == TX_MODE_SELECT &&
          cpi->td.mb.txfm_search_info.txb_split_count == 0)
        features->tx_mode = TX_MODE_LARGEST;
    }
  } else {
    // This is needed if real-time speed setting is changed on the fly
    // from one using compound prediction to one using single reference.
    if (current_frame->reference_mode == REFERENCE_MODE_SELECT)
      current_frame->reference_mode = SINGLE_REFERENCE;
    encode_frame_internal(cpi);
  }
}